

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O3

err_t bignParamsEnc(octet *der,size_t *count,bign_params *params)

{
  bool_t bVar1;
  size_t sVar2;
  err_t eVar3;
  
  bVar1 = memIsValid(params,0x150);
  eVar3 = 0x6d;
  if ((bVar1 != 0) && (bVar1 = memIsValid(count,8), bVar1 != 0)) {
    if ((der != (octet *)0x0) && (bVar1 = memIsValid(der,*count), bVar1 == 0)) {
      return 0x6d;
    }
    bVar1 = bignIsOperable(params);
    eVar3 = 0x1f6;
    if ((bVar1 != 0) &&
       (sVar2 = bignParamsEnc_internal((octet *)0x0,params), sVar2 != 0xffffffffffffffff)) {
      if (der != (octet *)0x0) {
        if (*count < sVar2) {
          return 0x6e;
        }
        sVar2 = bignParamsEnc_internal(der,params);
      }
      *count = sVar2;
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

err_t bignParamsEnc(octet der[], size_t* count, const bign_params* params)
{
	size_t len;
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(count, O_PER_S) ||
		!memIsNullOrValid(der, *count))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	len = bignParamsEnc_internal(0, params);
	if (len == SIZE_MAX)
		return ERR_BAD_PARAMS;
	if (der)
	{
		if (*count < len)
			return ERR_OUTOFMEMORY;
		len = bignParamsEnc_internal(der, params);
		ASSERT(len != SIZE_MAX);
	}
	*count = len;
	return ERR_OK;
}